

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

string * __thiscall
embree::BVHNStatistics<8>::Statistics::NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,8>>::
toString_abi_cxx11_(string *__return_storage_ptr__,void *this,BVH *bvh,double sahTotal,
                   size_t bytesTotal)

{
  ostream *poVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ostringstream stream;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 4;
  poVar1 = std::operator<<((ostream *)local_1a0,"sah = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 3;
  dVar2 = NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_>::sah
                    ((NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_> *)this,(BVH *)bvh);
  std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<((ostream *)local_1a0," (");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  dVar2 = NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_>::sah
                    ((NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_> *)this,(BVH *)bvh);
  poVar1 = std::ostream::_M_insert<double>((dVar2 * 100.0) / sahTotal);
  std::operator<<(poVar1,"%), ");
  poVar1 = std::operator<<((ostream *)local_1a0,"#bytes = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(long *)((long)this + 8) << 8;
  auVar3 = vpunpckldq_avx(auVar3,_DAT_01f46b10);
  auVar3 = vsubpd_avx(auVar3,_DAT_01f46b20);
  poVar1 = std::ostream::_M_insert<double>((auVar3._0_8_ + auVar3._8_8_) / 1000000.0);
  std::operator<<(poVar1," MB ");
  poVar1 = std::operator<<((ostream *)local_1a0,"(");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(long *)((long)this + 8) << 8;
  auVar3 = vpunpckldq_avx(auVar4,ZEXT816(0x4530000043300000));
  auVar4 = vsubpd_avx(auVar3,_DAT_01f46b20);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = bytesTotal;
  auVar3 = vpunpckldq_avx(auVar7,ZEXT816(0x4530000043300000));
  auVar3 = vsubpd_avx(auVar3,_DAT_01f46b20);
  poVar1 = std::ostream::_M_insert<double>
                     (((auVar4._0_8_ + auVar4._8_8_) * 100.0) / (auVar3._0_8_ + auVar3._8_8_));
  std::operator<<(poVar1,"%), ");
  poVar1 = std::operator<<((ostream *)local_1a0,"#nodes = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," (");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)((long)this + 0x10);
  auVar3 = vunpcklps_avx(auVar5,ZEXT816(0x4530000043300000));
  auVar4 = vsubpd_avx(auVar3,_DAT_01f46b20);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(long *)((long)this + 8) << 3;
  auVar3 = vpunpckldq_avx(auVar8,ZEXT816(0x4530000043300000));
  auVar3 = vsubpd_avx(auVar3,_DAT_01f46b20);
  poVar1 = std::ostream::_M_insert<double>
                     (((auVar4._0_8_ + auVar4._8_8_) / (auVar3._0_8_ + auVar3._8_8_)) * 100.0);
  std::operator<<(poVar1,"% filled), ");
  poVar1 = std::operator<<((ostream *)local_1a0,"#bytes/prim = ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 8) = 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(long *)((long)this + 8) << 8;
  auVar3 = vpunpckldq_avx(auVar6,ZEXT816(0x4530000043300000));
  auVar4 = vsubpd_avx(auVar3,_DAT_01f46b20);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = bvh->numPrimitives;
  auVar3 = vpunpckldq_avx(auVar9,ZEXT816(0x4530000043300000));
  auVar3 = vsubpd_avx(auVar3,_DAT_01f46b20);
  std::ostream::_M_insert<double>((auVar4._0_8_ + auVar4._8_8_) / (auVar3._0_8_ + auVar3._8_8_));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(BVH* bvh, double sahTotal, size_t bytesTotal) const
        {
          std::ostringstream stream;
          stream.setf(std::ios::fixed, std::ios::floatfield);
          stream << "sah = " << std::setw(7) << std::setprecision(3) << sah(bvh);
          stream << " (" << std::setw(6) << std::setprecision(2) << 100.0*sah(bvh)/sahTotal << "%), ";          
          stream << "#bytes = " << std::setw(7) << std::setprecision(2) << bytes()/1E6  << " MB ";
          stream << "(" << std::setw(6) << std::setprecision(2) << 100.0*double(bytes())/double(bytesTotal) << "%), ";
          stream << "#nodes = " << std::setw(7) << numNodes << " (" << std::setw(6) << std::setprecision(2) << 100.0*fillRate() << "% filled), ";
          stream << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(bytes())/double(bvh->numPrimitives);
          return stream.str();
        }